

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

bool __thiscall QSequentialAnimationGroupPrivate::atEnd(QSequentialAnimationGroupPrivate *this)

{
  QBindingStorage *this_00;
  QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
  *data;
  QBindingStatus *pQVar1;
  parameter_type pVar2;
  parameter_type pVar3;
  parameter_type pVar4;
  int iVar5;
  long lVar6;
  
  this_00 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage;
  pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper
              (this_00,(QUntypedPropertyData *)&this->currentAnimation);
  }
  pVar2 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
          ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                   *)&(((this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val)->
                      super_QObject).d_ptr.d[1].field_0x30);
  pVar3 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentLoop)
  ;
  data = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.loopCount;
  pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  if ((pVar3 == (data->super_QPropertyData<int>).val + -1) &&
     (pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
              ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                       direction), pVar4 == Forward)) {
    pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper
                (this_00,(QUntypedPropertyData *)&this->currentAnimation);
    }
    if ((this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val ==
        (this->super_QAnimationGroupPrivate).animations.d.ptr
        [(this->super_QAnimationGroupPrivate).animations.d.size + -1]) {
      lVar6 = (long)this->currentAnimationIndex;
      iVar5 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (this->super_QAnimationGroupPrivate).animations.d.ptr[lVar6]);
      if ((iVar5 == -1) && (iVar5 = -1, lVar6 < (this->actualDuration).d.size)) {
        iVar5 = (this->actualDuration).d.ptr[lVar6];
      }
      return pVar2 == iVar5;
    }
  }
  return false;
}

Assistant:

bool QSequentialAnimationGroupPrivate::atEnd() const
{
    // we try to detect if we're at the end of the group
    //this is true if the following conditions are true:
    // 1. we're in the last loop
    // 2. the direction is forward
    // 3. the current animation is the last one
    // 4. the current animation has reached its end
    const int animTotalCurrentTime = QAbstractAnimationPrivate::get(currentAnimation)->totalCurrentTime;
    return (currentLoop == loopCount - 1
        && direction == QAbstractAnimation::Forward
        && currentAnimation == animations.last()
        && animTotalCurrentTime == animationActualTotalDuration(currentAnimationIndex));
}